

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SplitterBehavior
               (ImGuiID id,ImRect *bb,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend)

{
  undefined8 *puVar1;
  uint uVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  undefined1 auVar5 [12];
  ImVec2 IVar6;
  ImVec2 IVar7;
  undefined8 uVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  ImGuiAxis IVar11;
  bool bVar12;
  int iVar13;
  ImU32 col;
  char cVar14;
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  bool held;
  bool hovered;
  bool local_a6;
  bool local_a5;
  float local_a4;
  float local_a0;
  ImGuiAxis local_9c;
  ImVec2 local_98;
  ImVec2 IStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float *local_70;
  float *local_68;
  ImGuiWindow *local_60;
  ImRect local_58;
  ImVec4 local_48;
  
  pIVar9 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  uVar2 = (pIVar4->DC).ItemFlags;
  (pIVar4->DC).ItemFlags = uVar2 | 0x18;
  local_a4 = min_size2;
  local_a0 = min_size1;
  local_9c = axis;
  local_88 = hover_extend;
  local_70 = size1;
  local_68 = size2;
  bVar12 = ItemAdd(bb,id,(ImRect *)0x0);
  IVar11 = local_9c;
  (pIVar4->DC).ItemFlags = uVar2;
  cVar14 = '\0';
  if (bVar12) {
    IVar6 = bb->Max;
    fVar18 = (float)((uint)local_88 & (int)((uint)(local_9c == ImGuiAxis_Y) << 0x1f) >> 0x1f);
    fVar15 = (float)(~((int)((uint)(local_9c == ImGuiAxis_Y) << 0x1f) >> 0x1f) & (uint)local_88);
    fVar17 = (bb->Min).y;
    local_88 = (bb->Min).x - fVar15;
    fStack_84 = fVar17 - fVar18;
    fStack_80 = IVar6.x - fVar15;
    fStack_7c = IVar6.y - fVar18;
    auVar5._4_4_ = IVar6.x;
    auVar5._8_4_ = IVar6.y;
    auVar5._0_4_ = fVar17 + fVar18;
    auVar16._0_8_ = auVar5._0_8_ << 0x20;
    auVar16._8_4_ = IVar6.x + fVar15;
    auVar16._12_4_ = IVar6.y + fVar18;
    local_58.Max = auVar16._8_8_;
    local_58.Min.y = fStack_84;
    local_58.Min.x = local_88;
    local_60 = pIVar4;
    ButtonBehavior(&local_58,id,&local_a5,&local_a6,0x60);
    pIVar10 = GImGui;
    if (pIVar9->ActiveId != id) {
      IVar3 = (GImGui->CurrentWindow->DC).LastItemId;
      if (GImGui->HoveredId == IVar3) {
        GImGui->HoveredIdAllowOverlap = true;
      }
      if (pIVar10->ActiveId == IVar3) {
        pIVar10->ActiveIdAllowOverlap = true;
      }
    }
    pIVar10 = GImGui;
    if (local_a6 == false) {
      if ((pIVar9->HoveredId == id) && (pIVar9->HoveredIdPreviousFrame == id)) {
        GImGui->MouseCursor = (IVar11 != ImGuiAxis_Y) + 3;
      }
      local_98.x = (bb->Min).x;
      local_98.y = (bb->Min).y;
      IStack_90.x = (bb->Max).x;
      IStack_90.y = (bb->Max).y;
    }
    else {
      GImGui->MouseCursor = (IVar11 != ImGuiAxis_Y) + 3;
      IVar6 = bb->Min;
      IVar7 = bb->Max;
      if (IVar11 == ImGuiAxis_Y) {
        fVar15 = ((pIVar9->IO).MousePos.y - (pIVar9->ActiveIdClickOffset).y) - fStack_84;
      }
      else {
        fVar15 = ((pIVar9->IO).MousePos.x - (pIVar9->ActiveIdClickOffset).x) - local_88;
      }
      fVar17 = local_a0 - *local_70;
      if (fVar17 <= fVar15) {
        fVar17 = fVar15;
      }
      fVar15 = *local_68 - local_a4;
      if (fVar17 <= *local_68 - local_a4) {
        fVar15 = fVar17;
      }
      *local_70 = *local_70 + fVar15;
      *local_68 = *local_68 - fVar15;
      fVar17 = (float)((uint)fVar15 & (int)((uint)(IVar11 == ImGuiAxis_X) << 0x1f) >> 0x1f);
      fVar15 = (float)(~((int)((uint)(IVar11 == ImGuiAxis_X) << 0x1f) >> 0x1f) & (uint)fVar15);
      local_98.x = IVar6.x;
      local_98.y = IVar6.y;
      IStack_90.x = IVar7.x;
      IStack_90.y = IVar7.y;
      local_98.x = fVar17 + local_98.x;
      local_98.y = fVar15 + local_98.y;
      IStack_90.x = fVar17 + IStack_90.x;
      IStack_90.y = fVar15 + IStack_90.y;
    }
    iVar13 = 0x1d;
    if (local_a6 == false) {
      iVar13 = (local_a5 & 1) + 0x1b;
    }
    puVar1 = (undefined8 *)((long)&(pIVar10->Style).Colors[0].x + (ulong)(uint)(iVar13 << 4));
    local_48._0_8_ = *puVar1;
    uVar8 = puVar1[1];
    local_48.w = (float)((ulong)uVar8 >> 0x20);
    local_48.z = (float)uVar8;
    local_48.w = (pIVar10->Style).Alpha * local_48.w;
    col = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRectFilled
              (local_60->DrawList,&local_98,&IStack_90,col,(pIVar9->Style).FrameRounding,0xf);
    cVar14 = local_a6;
  }
  return (bool)cVar14;
}

Assistant:

bool ImGui::SplitterBehavior(ImGuiID id, const ImRect& bb, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        if (mouse_delta < min_size1 - *size1)
            mouse_delta = min_size1 - *size1;
        if (mouse_delta > *size2 - min_size2)
            mouse_delta = *size2 - min_size2;

        // Apply resize
        *size1 += mouse_delta;
        *size2 -= mouse_delta;
        bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, g.Style.FrameRounding);

    return held;
}